

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O1

void small_alloc_destroy(small_alloc *alloc)

{
  mempool *pool;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = alloc->small_mempool_cache_size != 0;
  if (bVar3) {
    uVar2 = 0;
    do {
      pool = &alloc->small_mempool_cache[uVar2].pool;
      uVar1 = (int)uVar2 + (uint)bVar3;
      uVar2 = (ulong)uVar1;
      mempool_destroy(pool);
      bVar3 = uVar1 < alloc->small_mempool_cache_size;
    } while (bVar3);
  }
  return;
}

Assistant:

struct mempool *
mempool_iterator_next(struct mempool_iterator *it)
{
	struct small_mempool *small_mempool = NULL;
	if (it->small_iterator < it->alloc->small_mempool_cache_size)
		small_mempool =
			&it->alloc->small_mempool_cache[(it->small_iterator)++];
	if (small_mempool)
		return &(small_mempool->pool);

	return NULL;
}